

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long
AdaptingInputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostInputChannels,unsigned_long framesToProcess)

{
  unsigned_long uVar1;
  PaStreamCallbackTimeInfo *pPVar2;
  uint uVar3;
  int iVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  PaUtilChannelDescriptor *pPVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  uint uVar12;
  void **ppvVar13;
  void **local_60;
  
  uVar6 = 0;
  do {
    uVar11 = bp->framesPerUserBuffer;
    uVar1 = bp->framesInTempInputBuffer;
    uVar10 = uVar11 - uVar1;
    if (uVar1 + framesToProcess <= uVar11) {
      uVar10 = framesToProcess;
    }
    if (bp->userInputIsInterleaved == 0) {
      uVar12 = bp->inputChannelCount;
      uVar3 = bp->bytesPerUserInputSample;
      ppvVar13 = (void **)(uVar1 * uVar3 + (long)bp->tempInputBuffer);
      if ((ulong)uVar12 != 0) {
        uVar8 = 0;
        uVar9 = 0;
        do {
          bp->tempInputBufferPtrs[uVar9] = (void *)(uVar8 * uVar11 + (long)bp->tempInputBuffer);
          uVar9 = uVar9 + 1;
          uVar8 = (ulong)((int)uVar8 + uVar3);
        } while (uVar12 != uVar9);
      }
      uVar3 = (int)uVar11 * uVar3;
      local_60 = bp->tempInputBufferPtrs;
      uVar12 = 1;
    }
    else {
      local_60 = (void **)bp->tempInputBuffer;
      uVar12 = bp->inputChannelCount;
      uVar3 = bp->bytesPerUserInputSample;
      ppvVar13 = (void **)(uVar1 * (uVar12 * uVar3) + (long)local_60);
    }
    if (bp->inputChannelCount != 0) {
      uVar11 = 0;
      pPVar7 = hostInputChannels;
      do {
        (*bp->inputConverter)
                  (ppvVar13,uVar12,pPVar7->data,pPVar7->stride,(uint)uVar10,&bp->ditherGenerator);
        ppvVar13 = (void **)((long)ppvVar13 + (ulong)uVar3);
        pPVar7->data = (void *)((long)pPVar7->data +
                               (ulong)bp->bytesPerHostInputSample * pPVar7->stride * uVar10);
        uVar11 = uVar11 + 1;
        pPVar7 = pPVar7 + 1;
      } while (uVar11 < bp->inputChannelCount);
    }
    uVar5 = bp->framesInTempInputBuffer + uVar10;
    bp->framesInTempInputBuffer = uVar5;
    uVar1 = bp->framesPerUserBuffer;
    if (uVar5 == uVar1) {
      if (*streamCallbackResult == 0) {
        pPVar2 = bp->timeInfo;
        pPVar2->outputBufferDacTime = 0.0;
        iVar4 = (*bp->streamCallback)
                          (local_60,(void *)0x0,uVar1,pPVar2,bp->callbackStatusFlags,bp->userData);
        *streamCallbackResult = iVar4;
        bp->timeInfo->inputBufferAdcTime =
             (((double)CONCAT44(0x45300000,(int)(bp->framesPerUserBuffer >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)bp->framesPerUserBuffer) - 4503599627370496.0)) *
             bp->samplePeriod + bp->timeInfo->inputBufferAdcTime;
      }
      bp->framesInTempInputBuffer = 0;
    }
    uVar6 = uVar6 + uVar10;
    framesToProcess = framesToProcess - uVar10;
  } while (framesToProcess != 0);
  return uVar6;
}

Assistant:

static unsigned long AdaptingInputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    
    userOutput = 0;

    do
    {
        frameCount = ( bp->framesInTempInputBuffer + framesToGo > bp->framesPerUserBuffer )
                ? ( bp->framesPerUserBuffer - bp->framesInTempInputBuffer )
                : framesToGo;

        /* convert frameCount samples into temp buffer */

        if( bp->userInputIsInterleaved )
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->inputChannelCount *
                    bp->framesInTempInputBuffer;
                      
            destSampleStrideSamples = bp->inputChannelCount;
            destChannelStrideBytes = bp->bytesPerUserInputSample;

            userInput = bp->tempInputBuffer;
        }
        else /* user input is not interleaved */
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

            destSampleStrideSamples = 1;
            destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;

            /* setup non-interleaved ptrs */
            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                    i * bp->bytesPerUserInputSample * bp->framesPerUserBuffer;
            }
                    
            userInput = bp->tempInputBufferPtrs;
        }

        for( i=0; i<bp->inputChannelCount; ++i )
        {
            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                    hostInputChannels[i].data,
                                    hostInputChannels[i].stride,
                                    frameCount, &bp->ditherGenerator );

            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

            /* advance src ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }

        bp->framesInTempInputBuffer += frameCount;

        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer )
        {
            /**
            @todo (non-critical optimisation)
            The conditional below implements the continue/complete/abort mechanism
            simply by continuing on iterating through the input buffer, but not
            passing the data to the callback. With care, the outer loop could be
            terminated earlier, thus some unneeded conversion cycles would be
            saved.
            */
            if( *streamCallbackResult == paContinue )
            {
                bp->timeInfo->outputBufferDacTime = 0;

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
            }
            
            bp->framesInTempInputBuffer = 0;
        }

        framesProcessed += frameCount;

        framesToGo -= frameCount;
    }while( framesToGo > 0 );

    return framesProcessed;
}